

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx.c
# Opt level: O0

void sx__debug_message(char *sourcefile,uint32_t line,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8f8 [24];
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined1 local_848 [8];
  va_list args;
  char local_828 [8];
  char text [2048];
  char *fmt_local;
  uint32_t line_local;
  char *sourcefile_local;
  
  if (in_AL != '\0') {
    local_8c8 = in_XMM0_Qa;
    local_8b8 = in_XMM1_Qa;
    local_8a8 = in_XMM2_Qa;
    local_898 = in_XMM3_Qa;
    local_888 = in_XMM4_Qa;
    local_878 = in_XMM5_Qa;
    local_868 = in_XMM6_Qa;
    local_858 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_8f8;
  args[0]._0_8_ = &stack0x00000008;
  local_848._4_4_ = 0x30;
  local_848._0_4_ = 0x18;
  local_8e0 = in_RCX;
  local_8d8 = in_R8;
  local_8d0 = in_R9;
  sx_vsnprintf(local_828,0x800,fmt,(__va_list_tag *)local_848);
  (*g_assert_handler)(local_828,sourcefile,line);
  return;
}

Assistant:

void sx__debug_message(const char* sourcefile, uint32_t line, const char* fmt, ...)
{
    char text[2048];

    va_list args;
    va_start(args, fmt);
    sx_vsnprintf(text, sizeof(text), fmt, args);
    va_end(args);

    g_assert_handler(text, sourcefile, line);
}